

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprNodeTest_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  int iVar1;
  u32 nData;
  Fts5ExprPhrase *pFVar2;
  long lVar3;
  Fts5IndexIter *pFVar4;
  u8 *puVar5;
  Fts5ExprPhrase *pFVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Fts5ExprTerm *p;
  Fts5ExprTerm *pFVar10;
  Fts5LookaheadReader *pFVar11;
  ulong uVar12;
  uint uVar13;
  Fts5ExprTerm *p_1;
  long lVar14;
  Fts5ExprNearset *pFVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  Fts5ExprTerm *p_2;
  int *piVar20;
  i64 *piVar21;
  Fts5LookaheadReader *pFVar22;
  bool bVar23;
  int n;
  u8 *a;
  int rc;
  Fts5PoslistWriter writer;
  Fts5PoslistReader aStatic [4];
  int local_15c;
  Fts5ExprNearset *local_158;
  Fts5LookaheadReader *local_150;
  int local_144;
  Fts5Expr *local_140;
  Fts5ExprNearset *local_138;
  u8 *local_130;
  Fts5Buffer local_128;
  Fts5PoslistWriter local_110;
  Fts5Buffer *local_108;
  int *local_100;
  Fts5LookaheadReader local_f8 [6];
  
  pFVar15 = pNode->pNear;
  pFVar2 = pFVar15->apPhrase[0];
  uVar13 = pExpr->bDesc;
  if (pFVar2->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
    lVar14 = (pFVar2->aTerm[0].pIter)->iRowid;
  }
  else {
    pFVar10 = pFVar2->aTerm;
    lVar14 = 0;
    bVar23 = false;
    do {
      if ((pFVar10->pIter->bEof == '\0') &&
         ((lVar17 = pFVar10->pIter->iRowid, !bVar23 || (bVar23 = true, uVar13 != lVar17 < lVar14))))
      {
        bVar23 = true;
        lVar14 = lVar17;
      }
      pFVar10 = pFVar10->pSynonym;
    } while (pFVar10 != (Fts5ExprTerm *)0x0);
  }
  iVar8 = pFVar15->nPhrase;
  local_140 = pExpr;
  local_138 = pFVar15;
  do {
    if (iVar8 < 1) break;
    bVar23 = true;
    local_158 = (Fts5ExprNearset *)0x0;
    do {
      pFVar2 = pFVar15->apPhrase[(long)local_158];
      if (0 < pFVar2->nTerm) {
        local_150 = (Fts5LookaheadReader *)pFVar2->aTerm;
        lVar18 = 0;
        lVar17 = lVar14;
        do {
          pFVar11 = local_150 + lVar18;
          lVar14 = lVar17;
          if (local_150[lVar18].iLookahead == 0) {
            pFVar4 = (Fts5IndexIter *)pFVar11->iPos;
            lVar19 = pFVar4->iRowid;
            if ((lVar19 != lVar17) && (pFVar4->bEof == '\0')) {
              bVar23 = false;
              if ((uVar13 == 0 && lVar19 < lVar17) ||
                 (lVar14 = lVar19, uVar13 != 0 && lVar17 < lVar19)) {
                iVar8 = sqlite3Fts5IterNextFrom(pFVar4,lVar17);
                if ((iVar8 != 0) || (pFVar4->bEof != '\0')) {
                  pNode->bEof = 1;
                  return iVar8;
                }
                lVar14 = pFVar4->iRowid;
              }
            }
          }
          else {
            lVar19 = 0;
            bVar7 = false;
            pFVar22 = pFVar11;
            do {
              if ((*(char *)((long)pFVar22->iPos + 0x14) == '\0') &&
                 ((lVar3 = *(long *)pFVar22->iPos, !bVar7 ||
                  (bVar7 = true, uVar13 != lVar3 < lVar19)))) {
                bVar7 = true;
                lVar19 = lVar3;
              }
              pFVar22 = (Fts5LookaheadReader *)pFVar22->iLookahead;
            } while (pFVar22 != (Fts5LookaheadReader *)0x0);
            pFVar22 = pFVar11;
            if (lVar19 != lVar17) {
              do {
                pFVar4 = (Fts5IndexIter *)pFVar22->iPos;
                iVar8 = 0;
                if (pFVar4->bEof == '\0') {
                  if ((uVar13 == 0 && pFVar4->iRowid < lVar17) ||
                     (uVar13 != 0 && lVar17 < pFVar4->iRowid)) {
                    iVar8 = sqlite3Fts5IterNextFrom(pFVar4,lVar17);
                  }
                }
              } while ((iVar8 == 0) &&
                      (piVar21 = &pFVar22->iLookahead, pFVar22 = (Fts5LookaheadReader *)*piVar21,
                      (Fts5LookaheadReader *)*piVar21 != (Fts5LookaheadReader *)0x0));
              if (iVar8 != 0) {
LAB_001a7a3e:
                pNode->bEof = 1;
                pNode->bNomatch = 0;
                return iVar8;
              }
              lVar14 = 0;
              bVar7 = false;
              do {
                if ((*(char *)((long)pFVar11->iPos + 0x14) == '\0') &&
                   ((lVar17 = *(long *)pFVar11->iPos, !bVar7 ||
                    (bVar7 = true, uVar13 != lVar17 < lVar14)))) {
                  bVar7 = true;
                  lVar14 = lVar17;
                }
                pFVar11 = (Fts5LookaheadReader *)pFVar11->iLookahead;
              } while (pFVar11 != (Fts5LookaheadReader *)0x0);
              bVar23 = false;
              iVar8 = 0;
              if (!bVar7) goto LAB_001a7a3e;
            }
          }
          lVar18 = lVar18 + 1;
          lVar17 = lVar14;
        } while (lVar18 < pFVar2->nTerm);
        iVar8 = local_138->nPhrase;
        pFVar15 = local_138;
      }
      local_158 = (Fts5ExprNearset *)((long)local_158 + 1);
    } while ((long)local_158 < (long)iVar8);
  } while (!bVar23);
  pNode->iRowid = lVar14;
  pFVar15 = pNode->pNear;
  local_15c = 0;
  if (local_140->pConfig->eDetail == 0) {
    lVar14 = 0;
    local_158 = pFVar15;
    do {
      if (pFVar15->nPhrase <= lVar14) {
        iVar8 = 0;
        break;
      }
      pFVar2 = pFVar15->apPhrase[lVar14];
      uVar13 = pFVar2->nTerm;
      if ((long)(int)uVar13 < 2) {
        if (((pFVar2->aTerm[0].pSynonym != (Fts5ExprTerm *)0x0) ||
            (pFVar15->pColset != (Fts5Colset *)0x0)) || (pFVar2->aTerm[0].bFirst != '\0')) {
          local_140 = (Fts5Expr *)CONCAT71(local_140._1_7_,pFVar2->aTerm[0].bFirst);
          (pFVar2->poslist).n = 0;
          goto LAB_001a7b18;
        }
        pFVar4 = pFVar2->aTerm[0].pIter;
        nData = pFVar4->nData;
        puVar5 = pFVar4->pData;
        (pFVar2->poslist).n = 0;
        sqlite3Fts5BufferAppendBlob(&local_15c,&pFVar2->poslist,nData,puVar5);
      }
      else {
        local_110.iPrev = 0;
        local_140 = (Fts5Expr *)CONCAT71(local_140._1_7_,pFVar2->aTerm[0].bFirst);
        (pFVar2->poslist).n = 0;
        if (uVar13 < 5) {
LAB_001a7b18:
          local_110.iPrev = 0;
          pFVar11 = local_f8;
        }
        else {
          iVar8 = sqlite3_initialize();
          if ((iVar8 != 0) ||
             (pFVar11 = (Fts5LookaheadReader *)sqlite3Malloc((long)(int)uVar13 << 5),
             pFVar11 == (Fts5LookaheadReader *)0x0)) {
            local_15c = 7;
            iVar8 = 7;
            break;
          }
          uVar13 = pFVar2->nTerm;
        }
        memset(pFVar11,0,(long)(int)uVar13 << 5);
        uVar12 = (ulong)(uint)pFVar2->nTerm;
        local_150 = pFVar11;
        if (pFVar2->nTerm < 1) {
LAB_001a7c16:
          local_108 = &pFVar2->poslist;
          local_100 = &local_150->i;
          pFVar11 = local_150;
          do {
            pFVar15 = (Fts5ExprNearset *)pFVar11->iLookahead;
            do {
              if ((int)uVar12 < 1) break;
              bVar23 = true;
              lVar17 = 0;
              do {
                lVar18 = (long)&pFVar15->nNear + lVar17;
                if (pFVar11[lVar17].iLookahead != lVar18) {
                  pFVar22 = pFVar11 + lVar17;
                  local_138 = pFVar15;
LAB_001a7c64:
                  lVar19 = pFVar11[lVar17].iLookahead;
                  if (lVar19 < lVar18) {
                    iVar8 = sqlite3Fts5PoslistNext64
                                      (pFVar22->a,pFVar22->n,&pFVar22->i,&pFVar11[lVar17].iLookahead
                                      );
                    if (iVar8 == 0) goto code_r0x001a7c86;
                    *(undefined1 *)((long)&pFVar22->iPos + 1) = 1;
                    goto LAB_001a7d43;
                  }
                  pFVar15 = local_138;
                  if (lVar18 < lVar19) {
                    pFVar15 = (Fts5ExprNearset *)(lVar19 - lVar17);
                  }
                  uVar12 = (ulong)(uint)pFVar2->nTerm;
                  bVar23 = false;
                  pFVar11 = local_150;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar12);
            } while (!bVar23);
            if (((char)local_140 == '\0') || (((ulong)pFVar15 & 0x7fffffff) == 0)) {
              iVar8 = sqlite3Fts5PoslistWriterAppend(local_108,&local_110,(i64)pFVar15);
              if (iVar8 != 0) goto LAB_001a7d60;
              uVar12 = (ulong)(uint)pFVar2->nTerm;
            }
            if (0 < (int)uVar12) {
              lVar17 = 0;
              piVar20 = local_100;
              do {
                iVar8 = sqlite3Fts5PoslistNext64
                                  (((Fts5LookaheadReader *)(piVar20 + -3))->a,piVar20[-1],piVar20,
                                   (i64 *)(piVar20 + 3));
                if (iVar8 != 0) {
                  *(undefined1 *)((long)piVar20 + 5) = 1;
                  goto LAB_001a7d55;
                }
                if (*(char *)((long)piVar20 + 5) != '\0') goto LAB_001a7d55;
                lVar17 = lVar17 + 1;
                uVar12 = (ulong)pFVar2->nTerm;
                piVar20 = piVar20 + 8;
              } while (lVar17 < (long)uVar12);
            }
          } while( true );
        }
        piVar20 = &pFVar11->i;
        lVar17 = 0;
        pFVar6 = pFVar2;
        while( true ) {
          local_144 = 0;
          local_130 = (u8 *)0x0;
          if (pFVar6->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
            pFVar4 = pFVar6->aTerm[0].pIter;
            local_130 = pFVar4->pData;
            local_144 = pFVar4->nData;
            bVar23 = false;
          }
          else {
            local_128.p = (u8 *)0x0;
            local_128.n = 0;
            local_128.nSpace = 0;
            iVar8 = fts5ExprSynonymList(pFVar6->aTerm,pNode->iRowid,&local_128,&local_130,&local_144
                                       );
            if (iVar8 != 0) {
              sqlite3_free(local_130);
              goto LAB_001a7d60;
            }
            bVar23 = local_130 == local_128.p;
          }
          *(undefined8 *)(piVar20 + -1) = 0;
          *(i64 *)(piVar20 + 1) = 0;
          *(i64 *)(piVar20 + 3) = 0;
          ((Fts5LookaheadReader *)(piVar20 + -3))->a = local_130;
          piVar20[-1] = local_144;
          iVar8 = sqlite3Fts5PoslistNext64(local_130,local_144,piVar20,(i64 *)(piVar20 + 3));
          if (iVar8 != 0) break;
          *(bool *)(piVar20 + 1) = bVar23;
          if (*(char *)((long)piVar20 + 5) != '\0') goto LAB_001a7d55;
          lVar17 = lVar17 + 1;
          uVar12 = (ulong)pFVar2->nTerm;
          piVar20 = piVar20 + 8;
          pFVar6 = (Fts5ExprPhrase *)pFVar6->aTerm;
          if ((long)uVar12 <= lVar17) goto LAB_001a7c16;
        }
        *(undefined1 *)((long)piVar20 + 5) = 1;
        *(bool *)(piVar20 + 1) = bVar23;
LAB_001a7d55:
        iVar8 = 0;
LAB_001a7d60:
        iVar1 = (pFVar2->poslist).n;
        iVar9 = pFVar2->nTerm;
        if (0 < iVar9) {
          piVar21 = &local_150->iPos;
          lVar17 = 0;
          do {
            if ((char)*piVar21 != '\0') {
              sqlite3_free(((Fts5LookaheadReader *)(piVar21 + -2))->a);
              iVar9 = pFVar2->nTerm;
            }
            lVar17 = lVar17 + 1;
            piVar21 = piVar21 + 4;
          } while (lVar17 < iVar9);
        }
        if (local_150 != local_f8) {
          sqlite3_free(local_150);
        }
        pFVar15 = local_158;
        local_15c = iVar8;
        if (iVar1 < 1) break;
      }
      lVar14 = lVar14 + 1;
      iVar8 = local_15c;
    } while (local_15c == 0);
    bVar23 = false;
    uVar13 = (uint)lVar14;
    if (pFVar15->nPhrase == uVar13) {
      if (uVar13 == 1) {
        bVar23 = true;
      }
      else {
        local_128.p = (u8 *)CONCAT44(local_128.p._4_4_,iVar8);
        if ((int)uVar13 < 5) {
          pFVar11 = local_f8;
          memset(pFVar11,0,0xc0);
        }
        else {
          pFVar11 = (Fts5LookaheadReader *)
                    sqlite3Fts5MallocZero((int *)&local_128,(ulong)(uVar13 & 0x7fffffff) * 0x30);
          iVar8 = (int)local_128.p;
        }
        pFVar15 = local_158;
        if (iVar8 == 0) {
          if (0 < local_158->nPhrase) {
            lVar14 = 0;
            pFVar22 = pFVar11;
            do {
              pFVar2 = pFVar15->apPhrase[lVar14];
              puVar5 = (pFVar2->poslist).p;
              iVar8 = (pFVar2->poslist).n;
              pFVar22->n = 0;
              pFVar22->i = 0;
              pFVar22->iPos = 0;
              pFVar22->iLookahead = 0;
              pFVar22->a = puVar5;
              pFVar22->n = iVar8;
              fts5LookaheadReaderNext(pFVar22);
              fts5LookaheadReaderNext(pFVar22);
              (pFVar2->poslist).n = 0;
              *(Fts5Buffer **)&pFVar22[1].n = &pFVar2->poslist;
              lVar14 = lVar14 + 1;
              pFVar22 = (Fts5LookaheadReader *)&pFVar22[1].iPos;
            } while (lVar14 < pFVar15->nPhrase);
          }
          local_150 = (Fts5LookaheadReader *)&pFVar11->iLookahead;
          do {
            lVar14 = pFVar11->iPos;
            uVar13 = local_158->nPhrase;
            do {
              if ((int)uVar13 < 1) goto LAB_001a800a;
              bVar23 = true;
              lVar17 = 0;
              do {
                lVar19 = lVar14 - ((long)local_158->nNear + (long)local_158->apPhrase[lVar17]->nTerm
                                  );
                lVar18 = *(long *)((long)pFVar11 + lVar17 * 0x30 + 0x10);
                if ((lVar14 < lVar18) || (lVar18 < lVar19)) {
                  pFVar22 = (Fts5LookaheadReader *)(lVar17 * 0x30 + (long)pFVar11);
                  while (lVar18 = pFVar22->iPos, lVar18 < lVar19) {
                    iVar8 = fts5LookaheadReaderNext(pFVar22);
                    if (iVar8 != 0) goto LAB_001a8024;
                  }
                  if (lVar14 < lVar18) {
                    lVar14 = lVar18;
                  }
                  uVar13 = local_158->nPhrase;
                  bVar23 = false;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar13);
            } while (!bVar23);
            if ((int)uVar13 < 1) {
LAB_001a800a:
              lVar14 = 0;
            }
            else {
              lVar14 = 0;
              pFVar22 = pFVar11 + 1;
              do {
                if (((*(Fts5Buffer **)&pFVar22->n)->n == 0) ||
                   ((u8 *)pFVar22[-1].iPos != pFVar22->a)) {
                  sqlite3Fts5PoslistWriterAppend
                            (*(Fts5Buffer **)&pFVar22->n,(Fts5PoslistWriter *)pFVar22,
                             pFVar22[-1].iPos);
                  uVar13 = local_158->nPhrase;
                }
                lVar14 = lVar14 + 1;
                pFVar22 = (Fts5LookaheadReader *)&pFVar22[1].iPos;
              } while (lVar14 < (int)uVar13);
              if ((int)uVar13 < 1) goto LAB_001a800a;
              lVar14 = *(long *)local_150;
              uVar16 = 0;
              uVar12 = 0;
              pFVar22 = local_150;
              do {
                if (*(long *)pFVar22 < lVar14) {
                  uVar12 = uVar16 & 0xffffffff;
                  lVar14 = *(long *)pFVar22;
                }
                uVar16 = uVar16 + 1;
                pFVar22 = (Fts5LookaheadReader *)((long)pFVar22 + 0x30);
              } while (uVar13 != uVar16);
              lVar14 = (long)(int)uVar12;
            }
            iVar8 = fts5LookaheadReaderNext((Fts5LookaheadReader *)(lVar14 * 0x30 + (long)pFVar11));
          } while (iVar8 == 0);
LAB_001a8024:
          iVar1 = *(int *)(*(long *)&pFVar11[1].n + 8);
          iVar8 = (int)local_128.p;
          if (pFVar11 != local_f8) {
            sqlite3_free(pFVar11);
          }
          bVar23 = 0 < iVar1;
        }
      }
    }
  }
  else {
    pFVar2 = pFVar15->apPhrase[0];
    (pFVar2->poslist).n = 0;
    pFVar10 = pFVar2->aTerm;
    bVar23 = false;
    do {
      pFVar4 = pFVar10->pIter;
      if (((pFVar4->bEof == '\0') && (pFVar4->iRowid == lVar14)) && (0 < pFVar4->nData)) {
        (pFVar2->poslist).n = 1;
        bVar23 = true;
      }
      pFVar10 = pFVar10->pSynonym;
    } while (pFVar10 != (Fts5ExprTerm *)0x0);
    iVar8 = 0;
  }
  pNode->bNomatch = (uint)(!bVar23 && iVar8 == 0);
  return iVar8;
code_r0x001a7c86:
  if (*(char *)((long)&pFVar22->iPos + 1) != '\0') {
LAB_001a7d43:
    iVar8 = 0;
    goto LAB_001a7d60;
  }
  goto LAB_001a7c64;
}

Assistant:

static int fts5ExprNodeTest_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode
){
  Fts5ExprNearset *pNear = pNode->pNear;
  Fts5ExprPhrase *pLeft = pNear->apPhrase[0];
  int rc = SQLITE_OK;
  i64 iLast;                      /* Lastest rowid any iterator points to */
  int i, j;                       /* Phrase and token index, respectively */
  int bMatch;                     /* True if all terms are at the same rowid */
  const int bDesc = pExpr->bDesc;

  /* Check that this node should not be FTS5_TERM */
  assert( pNear->nPhrase>1 
       || pNear->apPhrase[0]->nTerm>1 
       || pNear->apPhrase[0]->aTerm[0].pSynonym
       || pNear->apPhrase[0]->aTerm[0].bFirst
  );

  /* Initialize iLast, the "lastest" rowid any iterator points to. If the
  ** iterator skips through rowids in the default ascending order, this means
  ** the maximum rowid. Or, if the iterator is "ORDER BY rowid DESC", then it
  ** means the minimum rowid.  */
  if( pLeft->aTerm[0].pSynonym ){
    iLast = fts5ExprSynonymRowid(&pLeft->aTerm[0], bDesc, 0);
  }else{
    iLast = pLeft->aTerm[0].pIter->iRowid;
  }

  do {
    bMatch = 1;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      for(j=0; j<pPhrase->nTerm; j++){
        Fts5ExprTerm *pTerm = &pPhrase->aTerm[j];
        if( pTerm->pSynonym ){
          i64 iRowid = fts5ExprSynonymRowid(pTerm, bDesc, 0);
          if( iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprSynonymAdvanceto(pTerm, bDesc, &iLast, &rc) ){
            pNode->bNomatch = 0;
            pNode->bEof = 1;
            return rc;
          }
        }else{
          Fts5IndexIter *pIter = pPhrase->aTerm[j].pIter;
          if( pIter->iRowid==iLast || pIter->bEof ) continue;
          bMatch = 0;
          if( fts5ExprAdvanceto(pIter, bDesc, &iLast, &rc, &pNode->bEof) ){
            return rc;
          }
        }
      }
    }
  }while( bMatch==0 );

  pNode->iRowid = iLast;
  pNode->bNomatch = ((0==fts5ExprNearTest(&rc, pExpr, pNode)) && rc==SQLITE_OK);
  assert( pNode->bEof==0 || pNode->bNomatch==0 );

  return rc;
}